

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

bool __thiscall
phpconvert::ZendParser::isRestricted(ZendParser *this,string *className,string *classNameLower)

{
  bool bVar1;
  
  bVar1 = isKeyword(this,classNameLower);
  if (bVar1) {
    return true;
  }
  bVar1 = isBuiltInType(this,className);
  return bVar1;
}

Assistant:

bool ZendParser::isRestricted(const string &className, const string &classNameLower) { //@todo has no sense
        return isKeyword(classNameLower) //cant be keyword here , keywords must not be touched
               || isBuiltInType(className); //@todo isDuplicate too
    }